

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bad_fd.c
# Opt level: O1

void test_bad_fd(void)

{
  int iVar1;
  archive *a;
  
  a = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_bad_fd.c"
                   ,L' ',(uint)(a != (archive *)0x0),"(a = archive_read_new()) != NULL",(void *)0x0)
  ;
  iVar1 = archive_read_support_filter_all(a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_bad_fd.c"
                   ,L'!',(uint)(iVar1 == 0),"0 == archive_read_support_filter_all(a)",a);
  iVar1 = archive_read_open_fd(a,-1,0x400);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_bad_fd.c"
                   ,L'\"',(uint)(iVar1 == -0x1e),
                   "ARCHIVE_FATAL == archive_read_open_fd(a, -1, 1024)",a);
  iVar1 = archive_read_close(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_bad_fd.c"
                      ,L'#',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",a);
  iVar1 = archive_read_free(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_bad_fd.c"
                      ,L'$',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_bad_fd)
{
	struct archive *a;
	assert((a = archive_read_new()) != NULL);
	assertA(0 == archive_read_support_filter_all(a));
	assertA(ARCHIVE_FATAL == archive_read_open_fd(a, -1, 1024));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}